

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  string *in_RDX;
  streambuf *sb;
  char c;
  
  std::ios::rdbuf();
  std::__cxx11::string::clear();
  while( true ) {
    while( true ) {
      cVar1 = std::streambuf::sbumpc();
      if (cVar1 == -1) {
        std::istream::get();
        bVar2 = std::__cxx11::string::empty();
        return (bool)((bVar2 ^ 0xff) & 1);
      }
      if ((((cVar1 == ' ') || (cVar1 == '\n')) || (cVar1 == '\r')) ||
         (((cVar1 == '\t' || (cVar1 == '\v')) || ((cVar1 == '\f' || (cVar1 == '\0')))))) break;
      std::__cxx11::string::push_back((char)in_RDX);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) break;
    if (cVar1 == '\n') {
      std::__cxx11::string::operator+=(in_RDX,(string *)EOS_abi_cxx11_);
      return true;
    }
  }
  if (cVar1 == '\n') {
    std::streambuf::sungetc();
  }
  return true;
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const
{
  char c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' || c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}